

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O3

BOOL __thiscall
LASquadtree::intersect_circle_with_rectangle
          (LASquadtree *this,F64 center_x,F64 center_y,F64 radius,F32 r_min_x,F32 r_max_x,
          F32 r_min_y,F32 r_max_y)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = (double)radius * (double)radius;
  if ((double)center_x <= (double)(float)r_max_x) {
    if ((double)center_x < (double)(float)r_min_x) {
      dVar3 = (double)(float)r_min_x - (double)center_x;
      if ((double)center_y <= (double)(float)r_max_y) {
        if ((double)(float)r_min_y <= (double)center_y) {
          bVar2 = (double)radius == dVar3;
          bVar1 = (double)radius < dVar3;
          goto LAB_00125970;
        }
        dVar4 = (double)(float)r_min_y - (double)center_y;
        dVar3 = dVar3 * dVar3 + dVar4 * dVar4;
      }
      else {
        dVar4 = (double)center_y - (double)(float)r_max_y;
        dVar3 = dVar3 * dVar3 + dVar4 * dVar4;
      }
      bVar2 = dVar5 == dVar3;
      bVar1 = dVar5 < dVar3;
      goto LAB_00125970;
    }
    if ((double)(float)r_max_y < (double)center_y) {
      dVar5 = (double)center_y - (double)(float)r_max_y;
      bVar2 = (double)radius == dVar5;
      bVar1 = (double)radius < dVar5;
      goto LAB_00125970;
    }
    if ((double)(float)r_min_y <= (double)center_y) {
      return true;
    }
    dVar3 = (double)(float)r_min_y - (double)center_y;
LAB_00125966:
    bVar2 = (double)radius == dVar3;
    bVar1 = (double)radius < dVar3;
  }
  else {
    dVar3 = (double)center_x - (double)(float)r_max_x;
    if ((double)center_y <= (double)(float)r_max_y) {
      if ((double)(float)r_min_y <= (double)center_y) goto LAB_00125966;
      dVar4 = (double)(float)r_min_y - (double)center_y;
      dVar3 = dVar3 * dVar3 + dVar4 * dVar4;
    }
    else {
      dVar4 = (double)center_y - (double)(float)r_max_y;
      dVar3 = dVar3 * dVar3 + dVar4 * dVar4;
    }
    bVar2 = dVar5 == dVar3;
    bVar1 = dVar5 < dVar3;
  }
LAB_00125970:
  return !bVar1 && !bVar2;
}

Assistant:

BOOL LASquadtree::intersect_circle_with_rectangle(const F64 center_x, const F64 center_y, const F64 radius, const F32 r_min_x, const F32 r_max_x, const F32 r_min_y, const F32 r_max_y)
{
  F64 r_diff_x, r_diff_y;
  F64 radius_squared = radius * radius;
  if (r_max_x < center_x) // R to left of circle center
  {
    r_diff_x = center_x - r_max_x;
    if (r_max_y < center_y) // R in lower left corner
    {
      r_diff_y = center_y - r_max_y;
      return ((r_diff_x * r_diff_x + r_diff_y * r_diff_y) < radius_squared);
    }
    else if (r_min_y > center_y) // R in upper left corner
    {
      r_diff_y = -center_y + r_min_y;
      return ((r_diff_x * r_diff_x + r_diff_y * r_diff_y) < radius_squared);
    }
    else // R due West of circle
    {
      return (r_diff_x < radius);
    }
  }
  else if (r_min_x > center_x) // R to right of circle center
  {
    r_diff_x = -center_x + r_min_x;
    if (r_max_y < center_y) // R in lower right corner
    {
      r_diff_y = center_y - r_max_y;
      return ((r_diff_x * r_diff_x + r_diff_y * r_diff_y) < radius_squared);
    }
    else if (r_min_y > center_y) // R in upper right corner
    {
      r_diff_y = -center_y + r_min_y;
      return ((r_diff_x * r_diff_x + r_diff_y * r_diff_y) < radius_squared);
    }
    else // R due East of circle
    {
      return (r_diff_x < radius);
    }
  }
  else // R on circle vertical centerline
  {
    if (r_max_y < center_y) // R due South of circle
    {
      r_diff_y = center_y - r_max_y;
      return (r_diff_y < radius);
    }
    else if (r_min_y > center_y) // R due North of circle
    {
      r_diff_y = -center_y + r_min_y;
      return (r_diff_y < radius);
    }
    else // R contains circle centerpoint
    {
      return TRUE;
    }
  }
}